

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

void ** adt_hash_iter_next(adt_hash_t *self,char **ppKey)

{
  byte bVar1;
  adt_hnode_t *pNode;
  adt_hmatch_t *paVar2;
  long lVar3;
  adt_hit_stored_t *pVal;
  undefined8 *__ptr;
  adt_hkey_t *paVar4;
  long lVar5;
  long lVar6;
  
  if (ppKey == (char **)0x0 || self == (adt_hash_t *)0x0) {
    return (void **)0x0;
  }
  paVar4 = (self->iter).pHkey;
  if (paVar4 == (adt_hkey_t *)0x0) {
    do {
      while( true ) {
        pNode = (self->iter).pNode;
        bVar1 = (self->iter).u8Cur;
        if (pNode->u8Width != '\x10') break;
        lVar5 = 0;
        lVar3 = (ulong)bVar1 * 0x10 + -0x10;
        do {
          lVar6 = lVar3;
          if (0xf < (ulong)bVar1 + lVar5) {
            if ((ulong)bVar1 + lVar5 != 0x10) goto LAB_00105e45;
            goto LAB_00105e1b;
          }
          paVar2 = (pNode->child).match;
          (self->iter).u8Cur = bVar1 + (char)lVar5 + '\x01';
          lVar5 = lVar5 + 1;
          lVar3 = lVar6 + 0x10;
        } while (*(char *)((long)&paVar2[1].u32Hash + lVar6 + 1) == '\0');
        pVal = adt_hit_stored_new(pNode,(char)lVar5 + bVar1);
        adt_stack_push(&self->iter_stack,pVal);
        (self->iter).pNode = (adt_hnode_t *)((long)&paVar2[1].u32Hash + lVar6);
        (self->iter).u8Cur = '\0';
      }
      if (bVar1 < pNode->u8Cur) {
        paVar2 = (pNode->child).match;
        (self->iter).u8Cur = bVar1 + 1;
        paVar4 = paVar2[bVar1].key;
        (self->iter).pHkey = paVar4;
        goto LAB_00105e61;
      }
LAB_00105e1b:
      __ptr = (undefined8 *)adt_stack_pop(&self->iter_stack);
      if (__ptr == (undefined8 *)0x0) goto LAB_00105e45;
      (self->iter).pNode = (adt_hnode_t *)*__ptr;
      (self->iter).u8Cur = *(uint8_t *)(__ptr + 1);
      free(__ptr);
    } while( true );
  }
LAB_00105e66:
  *ppKey = paVar4->key;
  paVar4 = (self->iter).pHkey;
  (self->iter).pHkey = paVar4->next;
  return &paVar4->val;
LAB_00105e45:
  paVar4 = (self->iter).pHkey;
LAB_00105e61:
  if (paVar4 == (adt_hkey_t *)0x0) {
    *ppKey = (char *)0x0;
    return (void **)0x0;
  }
  goto LAB_00105e66;
}

Assistant:

void** adt_hash_iter_next(adt_hash_t *self,const char **ppKey){
	if(!self || !ppKey ) return (void*) 0;

	if(self->iter.pHkey == 0){
		//find next hkey
		adt_hnode_t *pNode;
BEGIN:
		pNode =  self->iter.pNode;
		if(pNode->u8Width == 16){
			while(self->iter.u8Cur<16){
				adt_hnode_t *pChild = &pNode->child.node[self->iter.u8Cur++];
				if(pChild->u8Cur>0){
					adt_stack_push(&self->iter_stack,adt_hit_stored_new(pNode,self->iter.u8Cur));
					self->iter.pNode = pChild;
					self->iter.u8Cur = 0;
					goto BEGIN;
				}
			}
			if(self->iter.u8Cur==16){
				//check stack
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
		}
		else{
			if(self->iter.u8Cur >= pNode->u8Cur){
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
			else{
				self->iter.pHkey = pNode->child.match[self->iter.u8Cur++].key;
			}
		}
	}

	if(self->iter.pHkey){
      void **ppVal;
      *ppKey = self->iter.pHkey->key;
		ppVal = &self->iter.pHkey->val;
		self->iter.pHkey = self->iter.pHkey->next;
		return ppVal;
	}
	else{
		*ppKey=0;
		return (void**) 0; //done
	}
}